

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeRule
          (cmLocalUnixMakefileGenerator3 *this,ostream *os,char *comment,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *commands,bool symbolic,bool in_help)

{
  cmMakefile *this_00;
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  char *path;
  char *path_00;
  pointer pbVar6;
  allocator local_10b;
  allocator local_10a;
  allocator local_109;
  string binDir;
  string tgt;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  string replace;
  string local_50;
  
  local_78 = commands;
  if (target->_M_string_length != 0) {
    replace._M_dataplus._M_p = (pointer)&replace.field_2;
    replace._M_string_length = 0;
    replace.field_2._M_local_buf[0] = '\0';
    if (comment != (char *)0x0) {
      std::__cxx11::string::assign((char *)&replace);
      while( true ) {
        lVar2 = std::__cxx11::string::find((char)&replace,10);
        if (lVar2 == -1) break;
        poVar3 = std::operator<<(os,"# ");
        std::__cxx11::string::substr((ulong)&tgt,(ulong)&replace);
        poVar3 = std::operator<<(poVar3,(string *)&tgt);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&tgt);
      }
      poVar3 = std::operator<<(os,"# ");
      std::__cxx11::string::substr((ulong)&tgt,(ulong)&replace);
      poVar3 = std::operator<<(poVar3,(string *)&tgt);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&tgt);
    }
    pcVar4 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
    std::__cxx11::string::string((string *)&local_b8,pcVar4,(allocator *)&local_98);
    MaybeConvertToRelativePath(&binDir,this,&local_b8,target);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&tgt,(cmSystemTools *)binDir._M_dataplus._M_p,path);
    std::__cxx11::string::~string((string *)&binDir);
    std::__cxx11::string::~string((string *)&local_b8);
    pcVar4 = "";
    if (tgt._M_string_length == 1) {
      pcVar4 = " ";
    }
    if (symbolic) {
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string
                ((string *)&binDir,"CMAKE_MAKE_SYMBOLIC_RULE",(allocator *)&local_b8);
      pcVar5 = cmMakefile::GetDefinition(this_00,&binDir);
      std::__cxx11::string::~string((string *)&binDir);
      if (pcVar5 != (char *)0x0) {
        binDir._M_dataplus = tgt._M_dataplus;
        poVar3 = operator<<(os,(cmMakeSafe *)&binDir);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::operator<<(poVar3,"\n");
      }
    }
    if ((depends->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (depends->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      binDir._M_dataplus = tgt._M_dataplus;
      poVar3 = operator<<(os,(cmMakeSafe *)&binDir);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::operator<<(poVar3,":\n");
    }
    else {
      pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
      std::__cxx11::string::string((string *)&binDir,pcVar5,(allocator *)&local_b8);
      for (pbVar6 = (depends->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != (depends->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        std::__cxx11::string::_M_assign((string *)&replace);
        MaybeConvertToRelativePath(&local_98,this,&binDir,&replace);
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  (&local_b8,(cmSystemTools *)local_98._M_dataplus._M_p,path_00);
        std::__cxx11::string::operator=((string *)&replace,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
        local_b8._M_dataplus._M_p = tgt._M_dataplus._M_p;
        poVar3 = operator<<(os,(cmMakeSafe *)&local_b8);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,": ");
        local_98._M_dataplus._M_p = replace._M_dataplus._M_p;
        poVar3 = operator<<(poVar3,(cmMakeSafe *)&local_98);
        std::operator<<(poVar3,"\n");
      }
      std::__cxx11::string::~string((string *)&binDir);
    }
    std::__cxx11::string::string((string *)&local_b8,"\t",&local_109);
    std::__cxx11::string::string((string *)&local_98,"",&local_10a);
    std::__cxx11::string::string((string *)&local_50,"\n",&local_10b);
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&binDir,&local_b8,local_78,&local_98,&local_50);
    poVar3 = std::operator<<(os,(string *)&binDir);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&binDir);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    if (symbolic) {
      bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
      if (!bVar1) {
        poVar3 = std::operator<<(os,".PHONY : ");
        binDir._M_dataplus = tgt._M_dataplus;
        poVar3 = operator<<(poVar3,(cmMakeSafe *)&binDir);
        std::operator<<(poVar3,"\n");
      }
    }
    std::operator<<(os,"\n");
    if (in_help) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LocalHelp,target);
    }
    std::__cxx11::string::~string((string *)&tgt);
    std::__cxx11::string::~string((string *)&replace);
    return;
  }
  cmSystemTools::Error
            ("No target for WriteMakeRule! called with comment: ",comment,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeRule(
  std::ostream& os, const char* comment, const std::string& target,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands, bool symbolic, bool in_help)
{
  // Make sure there is a target.
  if (target.empty()) {
    cmSystemTools::Error("No target for WriteMakeRule! called with comment: ",
                         comment);
    return;
  }

  std::string replace;

  // Write the comment describing the rule in the makefile.
  if (comment) {
    replace = comment;
    std::string::size_type lpos = 0;
    std::string::size_type rpos;
    while ((rpos = replace.find('\n', lpos)) != std::string::npos) {
      os << "# " << replace.substr(lpos, rpos - lpos) << "\n";
      lpos = rpos + 1;
    }
    os << "# " << replace.substr(lpos) << "\n";
  }

  // Construct the left hand side of the rule.
  std::string tgt = cmSystemTools::ConvertToOutputPath(
    this->MaybeConvertToRelativePath(this->GetBinaryDirectory(), target)
      .c_str());

  const char* space = "";
  if (tgt.size() == 1) {
    // Add a space before the ":" to avoid drive letter confusion on
    // Windows.
    space = " ";
  }

  // Mark the rule as symbolic if requested.
  if (symbolic) {
    if (const char* sym =
          this->Makefile->GetDefinition("CMAKE_MAKE_SYMBOLIC_RULE")) {
      os << cmMakeSafe(tgt) << space << ": " << sym << "\n";
    }
  }

  // Write the rule.
  if (depends.empty()) {
    // No dependencies.  The commands will always run.
    os << cmMakeSafe(tgt) << space << ":\n";
  } else {
    // Split dependencies into multiple rule lines.  This allows for
    // very long dependency lists even on older make implementations.
    std::string binDir = this->GetBinaryDirectory();
    for (std::vector<std::string>::const_iterator dep = depends.begin();
         dep != depends.end(); ++dep) {
      replace = *dep;
      replace = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, replace).c_str());
      os << cmMakeSafe(tgt) << space << ": " << cmMakeSafe(replace) << "\n";
    }
  }

  // Write the list of commands.
  os << cmWrap("\t", commands, "", "\n") << "\n";
  if (symbolic && !this->IsWatcomWMake()) {
    os << ".PHONY : " << cmMakeSafe(tgt) << "\n";
  }
  os << "\n";
  // Add the output to the local help if requested.
  if (in_help) {
    this->LocalHelp.push_back(target);
  }
}